

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.hpp
# Opt level: O0

void __thiscall peach::fsm::NameFinder::NameFinder(NameFinder *this)

{
  element_type *peVar1;
  undefined1 local_60 [48];
  undefined1 local_30 [16];
  undefined1 local_20 [8];
  shared_ptr<peach::fsm::Node> firstNode;
  NameFinder *this_local;
  
  firstNode.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  FiniteStateMachine::FiniteStateMachine(&this->super_FiniteStateMachine);
  FiniteStateMachine::getRoot((FiniteStateMachine *)local_30);
  peVar1 = std::__shared_ptr_access<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  Node::
  addTransitionToNewNode<peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::RangeCharTransitionTemplate<(char)97,(char)122>,peach::transition::RangeCharTransitionTemplate<(char)65,(char)90>>,peach::transition::SingleCharTransitionTemplate<(char)95>>>
            ((Node *)local_20,(tokenCategory_t)peVar1);
  std::shared_ptr<peach::fsm::Node>::~shared_ptr((shared_ptr<peach::fsm::Node> *)local_30);
  peVar1 = std::__shared_ptr_access<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::shared_ptr<peach::fsm::Node>::shared_ptr
            ((shared_ptr<peach::fsm::Node> *)(local_60 + 0x10),
             (shared_ptr<peach::fsm::Node> *)local_20);
  Node::
  addTransition<peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::RangeCharTransitionTemplate<(char)97,(char)122>,peach::transition::RangeCharTransitionTemplate<(char)65,(char)90>>,peach::transition::SingleCharTransitionTemplate<(char)95>>,peach::transition::RangeCharTransitionTemplate<(char)48,(char)57>>>
            (peVar1,(shared_ptr<peach::fsm::Node> *)(local_60 + 0x10));
  std::shared_ptr<peach::fsm::Node>::~shared_ptr((shared_ptr<peach::fsm::Node> *)(local_60 + 0x10));
  peVar1 = std::__shared_ptr_access<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  Node::
  addTransitionToNewNode<peach::transition::TransitionNegation<peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::RangeCharTransitionTemplate<(char)97,(char)122>,peach::transition::RangeCharTransitionTemplate<(char)65,(char)90>>,peach::transition::SingleCharTransitionTemplate<(char)95>>,peach::transition::RangeCharTransitionTemplate<(char)48,(char)57>>>>
            ((Node *)local_60,(tokenCategory_t)peVar1);
  std::shared_ptr<peach::fsm::Node>::~shared_ptr((shared_ptr<peach::fsm::Node> *)local_60);
  std::shared_ptr<peach::fsm::Node>::~shared_ptr((shared_ptr<peach::fsm::Node> *)local_20);
  return;
}

Assistant:

NameFinder()
    {
        auto firstNode = getRoot()->addTransitionToNewNode<transition::LatinUnderscoreTransition>(token::tokenCategory::UNDEFINED);
        firstNode->addTransition<transition::LatinUnderscoreDigitTransition>(firstNode);
        firstNode->addTransitionToNewNode<transition::TransitionNegation<transition::LatinUnderscoreDigitTransition>>(token::tokenCategory::NAME);
    }